

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O0

uint64_t kratos::eval_bin_op(uint64_t left_value,uint64_t right_value,ExprOp op,uint32_t width,
                            bool signed_)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  runtime_error *this;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  __type_conflict4 _Var8;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_70;
  ulong local_68;
  ulong local_50;
  uint64_t result;
  uint64_t mask;
  uint64_t signed_bit;
  uint64_t right_abs_value;
  uint64_t left_abs_value;
  bool right_negative;
  bool left_negative;
  bool signed__local;
  uint32_t width_local;
  ExprOp op_local;
  uint64_t right_value_local;
  uint64_t left_value_local;
  
  cVar1 = (char)width;
  bVar6 = left_value >> (cVar1 - 1U & 0x3f) != 0;
  bVar2 = signed_ && bVar6;
  bVar7 = right_value >> (cVar1 - 1U & 0x3f) != 0;
  bVar3 = signed_ && bVar7;
  local_68 = left_value;
  if (signed_ && bVar6) {
    local_68 = two_complement(left_value,width);
  }
  local_70 = right_value;
  if (signed_ && bVar7) {
    local_70 = two_complement(right_value,width);
  }
  lVar4 = (ulong)(signed_ && bVar6 != bVar7) << (cVar1 - 1U & 0x3f);
  bVar5 = (byte)right_value;
  switch(op) {
  case Add:
    local_50 = left_value + right_value;
    break;
  case Minus:
    local_50 = left_value - right_value & 0xffffffffffffffffU >> (-cVar1 & 0x3fU);
    break;
  case Divide:
    local_50 = local_68 / local_70;
    if (lVar4 != 0) {
      local_50 = two_complement(local_50,width);
    }
    break;
  case Multiply:
    local_50 = local_68 * local_70;
    if (lVar4 != 0) {
      local_50 = two_complement(local_50,width);
    }
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case LogicalShiftRight:
    local_50 = left_value >> (bVar5 & 0x3f);
    break;
  case SignedShiftRight:
    local_50 = local_68 >> (bVar5 & 0x3f);
    if (bVar2) {
      local_50 = -1L << ((cVar1 + -1) - bVar5 & 0x3f) | local_50;
    }
    break;
  case Or:
    local_50 = left_value | right_value;
    break;
  case And:
    local_50 = left_value & right_value;
    break;
  case Xor:
    local_50 = left_value ^ right_value;
    break;
  case Power:
    _Var8 = std::pow<unsigned_long,unsigned_long>(left_value,right_value);
    local_50 = (long)_Var8 | (long)(_Var8 - 9.223372036854776e+18) & (long)_Var8 >> 0x3f;
    break;
  case LessThan:
    if ((!signed_ || !bVar6) || (bVar3)) {
      if ((bVar2) || (!signed_ || !bVar7)) {
        local_a8 = (ulong)(local_68 < local_70 != bVar2);
      }
      else {
        local_a8 = 0;
      }
      local_a0 = local_a8;
    }
    else {
      local_a0 = 1;
    }
    local_50 = local_a0;
    break;
  case GreaterThan:
    if ((!signed_ || !bVar6) || (bVar3)) {
      if ((bVar2) || (!signed_ || !bVar7)) {
        local_b8 = (ulong)(local_70 < local_68 != bVar2);
      }
      else {
        local_b8 = 1;
      }
      local_b0 = local_b8;
    }
    else {
      local_b0 = 0;
    }
    local_50 = local_b0;
    break;
  case LessEqThan:
    if ((!signed_ || !bVar6) || (bVar3)) {
      if ((bVar2) || (!signed_ || !bVar7)) {
        local_98 = (ulong)(local_68 <= local_70 != bVar2);
      }
      else {
        local_98 = 0;
      }
      local_90 = local_98;
    }
    else {
      local_90 = 1;
    }
    local_50 = local_90;
    break;
  case GreaterEqThan:
    if ((!signed_ || !bVar6) || (bVar3)) {
      if ((bVar2) || (!signed_ || !bVar7)) {
        local_88 = (ulong)(local_70 <= local_68 != bVar2);
      }
      else {
        local_88 = 1;
      }
      local_80 = local_88;
    }
    else {
      local_80 = 0;
    }
    local_50 = local_80;
    break;
  case Eq:
    local_50 = (ulong)(left_value == right_value);
  }
  return local_50 & 0xffffffffffffffffU >> (0x40U - cVar1 & 0x3f);
}

Assistant:

uint64_t eval_bin_op(uint64_t left_value, uint64_t right_value, ExprOp op, uint32_t width,
                     bool signed_) {
    bool left_negative = signed_ && left_value >> (width - 1);
    bool right_negative = signed_ && right_value >> (width - 1);
    uint64_t left_abs_value = left_negative ? two_complement(left_value, width) : left_value;
    uint64_t right_abs_value = right_negative ? two_complement(right_value, width) : right_value;
    uint64_t signed_bit = static_cast<uint64_t>(left_negative ^ right_negative) << (width - 1);
    auto const mask = UINT64_MASK >> (64u - width);
    uint64_t result;
    switch (op) {
        case ExprOp::Add:
            result = left_value + right_value;
            break;
        case ExprOp::Minus:
            result = (left_value - right_value) & mask;
            break;
        case ExprOp::Multiply:
            result = left_abs_value * right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::Divide:
            result = left_abs_value / right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::And:
            result = left_value & right_value;
            break;
        case ExprOp::Or:
            result = left_value | right_value;
            break;
        case ExprOp::Xor:
            result = left_value ^ right_value;
            break;
        case ExprOp::Eq:
            result = left_value == right_value;
            break;
        case ExprOp::Power:
            result = static_cast<uint64_t>(std::pow(left_value, right_value));
            break;
        case ExprOp::GreaterEqThan:
            result = left_abs_value >= right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::LessEqThan:
            result = left_abs_value <= right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp::LessThan:
            result = left_abs_value < right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp ::GreaterThan:
            result = left_abs_value > right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::SignedShiftRight:
            result = left_abs_value >> right_value;
            if (left_negative) result |= UINT64_MASK << (width - 1 - right_value);
            break;
        case ExprOp::LogicalShiftRight:
            result = left_value >> right_value;
            break;
        default: {
            throw std::runtime_error("Not implemented");
        }
    }
    result = result & (UINT64_MASK >> (64 - width));
    return result;
}